

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

char * __thiscall
cmCompiledGeneratorExpression::Evaluate
          (cmCompiledGeneratorExpression *this,cmLocalGenerator *lg,string *config,bool quiet,
          cmGeneratorTarget *headTarget,cmGeneratorTarget *currentTarget,
          cmGeneratorExpressionDAGChecker *dagChecker,string *language)

{
  char *pcVar1;
  cmGeneratorTarget *local_208;
  undefined1 local_1c8 [8];
  cmGeneratorExpressionContext context;
  cmGeneratorTarget *currentTarget_local;
  cmGeneratorTarget *headTarget_local;
  bool quiet_local;
  string *config_local;
  cmLocalGenerator *lg_local;
  cmCompiledGeneratorExpression *this_local;
  
  local_208 = headTarget;
  if (currentTarget != (cmGeneratorTarget *)0x0) {
    local_208 = currentTarget;
  }
  context._392_8_ = currentTarget;
  cmGeneratorExpressionContext::cmGeneratorExpressionContext
            ((cmGeneratorExpressionContext *)local_1c8,lg,config,quiet,headTarget,local_208,
             (bool)(this->EvaluateForBuildsystem & 1),&this->Backtrace,language);
  pcVar1 = EvaluateWithContext(this,(cmGeneratorExpressionContext *)local_1c8,dagChecker);
  cmGeneratorExpressionContext::~cmGeneratorExpressionContext
            ((cmGeneratorExpressionContext *)local_1c8);
  return pcVar1;
}

Assistant:

const char *cmCompiledGeneratorExpression::Evaluate(
  cmLocalGenerator* lg, const std::string& config, bool quiet,
  const cmGeneratorTarget* headTarget,
  const cmGeneratorTarget* currentTarget,
  cmGeneratorExpressionDAGChecker *dagChecker,
  std::string const& language) const
{
  cmGeneratorExpressionContext context(lg, config, quiet, headTarget,
                                  currentTarget ? currentTarget : headTarget,
                                  this->EvaluateForBuildsystem,
                                  this->Backtrace, language);

  return this->EvaluateWithContext(context, dagChecker);
}